

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_target.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  long lVar6;
  ostream *poVar7;
  undefined8 uVar8;
  Context context;
  allocator<char> local_61;
  Context local_60;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  doctest::Context::Context(&local_60,0,(char **)0x0);
  if (argc < 2) goto LAB_0012fa71;
  if ((int)*argv[1] - 0x30U < 10) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,argv[1],&local_61);
    plVar1 = local_58[0];
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    *piVar4 = 0;
    sVar5 = strtol((char *)plVar1,(char **)&local_38,10);
    if (local_38 != plVar1) {
      if (*piVar4 == 0) {
LAB_0012f9ac:
        *piVar4 = iVar3;
      }
      else if (*piVar4 == 0x22) {
        sVar5 = std::__throw_out_of_range("stol");
        goto LAB_0012f9ac;
      }
      number_trajectories = sVar5;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      goto LAB_0012f9d1;
    }
    std::__throw_invalid_argument("stol");
  }
  else {
LAB_0012f9d1:
    if ((argc == 2) || (9 < (int)*argv[2] - 0x30U)) {
LAB_0012fa71:
      doctest::Context::applyCommandLine(&local_60,argc,argv);
      position_random_1 = number_trajectories / 10;
      position_second_random_3 = number_trajectories / 0x19;
      if (249999 < position_second_random_3) {
        position_second_random_3 = 250000;
      }
      step_through_3 = 0;
      random_direction_3 = number_trajectories / 0x32;
      if (249999 < random_direction_3) {
        random_direction_3 = 250000;
      }
      random_discrete_3 = 250000;
      if (position_random_1 < 250000) {
        random_discrete_3 = position_random_1;
      }
      lVar6 = number_trajectories -
              (random_discrete_3 + random_direction_3 +
              (position_second_random_3 + position_random_1) * 2);
      position_random_3 = (ulong)(lVar6 * 0x5f) / 100;
      random_3_high = (ulong)(lVar6 * 5) / 100;
      velocity_random_3 = position_random_1;
      velocity_random_discrete_3 = random_discrete_3;
      velocity_second_random_3 = position_second_random_3;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<number_trajectories>",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tPosition (1 DoF): ",0x13);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tPosition (3 DoF): ",0x13);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tPosition Discrete (3 DoF): ",0x1c);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tPosition High Limits (3 DoF): ",0x1f);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tPosition Second Order (3 DoF): ",0x20);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tPosition Step Through (3 DoF): ",0x20);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tVelocity (3 DoF): ",0x13);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tVelocity Discrete (3 DoF): ",0x1c);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tVelocity Second Order (3 DoF): ",0x20);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total: ",7);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar3 = doctest::Context::run(&local_60);
      doctest::Context::~Context(&local_60);
      return iVar3;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,argv[2],&local_61);
    plVar1 = local_58[0];
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    *piVar4 = 0;
    lVar6 = strtol((char *)plVar1,(char **)&local_38,10);
    if (local_38 != plVar1) {
      iVar2 = (int)lVar6;
      if ((iVar2 == lVar6) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar3;
        }
        seed = iVar2;
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        goto LAB_0012fa71;
      }
      goto LAB_0012ff49;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0012ff49:
  uVar8 = std::__throw_out_of_range("stoi");
  doctest::Context::~Context(&local_60);
  _Unwind_Resume(uVar8);
}

Assistant:

int main(int argc, char** argv) {
    doctest::Context context;

    if (argc > 1 && std::isdigit(argv[1][0])) {
        number_trajectories = std::stol(argv[1]);
    }
    if (argc > 2 && std::isdigit(argv[2][0])) {
        seed = std::stoi(argv[2]);
    }

    context.applyCommandLine(argc, argv);

    position_random_1 = number_trajectories / 10;
    position_second_random_3 = std::min<size_t>(250000, number_trajectories / 25);
    step_through_3 = 0; // number_trajectories / 20;
    random_direction_3 = std::min<size_t>(250000, number_trajectories / 50);
    random_discrete_3 = std::min<size_t>(250000, number_trajectories / 10);
    velocity_random_3 = number_trajectories / 10;
    velocity_random_discrete_3 = std::min<size_t>(250000, number_trajectories / 10);
    velocity_second_random_3 = std::min<size_t>(250000, number_trajectories / 25);

    const size_t remainder = number_trajectories - (position_random_1 + step_through_3 + random_direction_3 + velocity_random_3 + random_discrete_3 + position_second_random_3 + velocity_second_random_3); // 1. Normal, 2. High
    position_random_3 = (size_t)(remainder * 95/100);
    random_3_high = (size_t)(remainder * 5/100);

    std::cout << "<number_trajectories>" << std::endl;
    std::cout << "\tPosition (1 DoF): " << position_random_1 << std::endl;
    std::cout << "\tPosition (3 DoF): " << position_random_3 << std::endl;
    std::cout << "\tPosition Discrete (3 DoF): " << random_discrete_3 << std::endl;
    std::cout << "\tPosition High Limits (3 DoF): " << random_3_high << std::endl;
    std::cout << "\tPosition Second Order (3 DoF): " << position_second_random_3 << std::endl;
    std::cout << "\tPosition Step Through (3 DoF): " << step_through_3 << std::endl;
    std::cout << "\tVelocity (3 DoF): " << velocity_random_3 << std::endl;
    std::cout << "\tVelocity Discrete (3 DoF): " << velocity_random_discrete_3 << std::endl;
    std::cout << "\tVelocity Second Order (3 DoF): " << velocity_second_random_3 << std::endl;
    std::cout << "Total: " << number_trajectories << std::endl;

    return context.run();
}